

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassesAndEnums
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *file)

{
  int i;
  long lVar1;
  Generator *this_00;
  int i_1;
  long lVar2;
  
  lVar2 = 0;
  this_00 = this;
  for (lVar1 = 0; lVar1 < *(int *)(file + 0x58); lVar1 = lVar1 + 1) {
    this_00 = this;
    GenerateClass(this,options,printer,(Descriptor *)(*(long *)(file + 0x60) + lVar2));
    lVar2 = lVar2 + 0xa8;
  }
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(file + 0x68); lVar2 = lVar2 + 1) {
    GenerateEnum(this_00,options,printer,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar1));
    lVar1 = lVar1 + 0x38;
  }
  return;
}

Assistant:

void Generator::GenerateClassesAndEnums(const GeneratorOptions& options,
                                        io::Printer* printer,
                                        const FileDescriptor* file) const {
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateClass(options, printer, file->message_type(i));
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnum(options, printer, file->enum_type(i));
  }
}